

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpu_helper.c
# Opt level: O0

uint32_t helper_float_cvts_w_mips64(CPUMIPSState_conflict5 *env,uint32_t wt0)

{
  float32 fVar1;
  uintptr_t unaff_retaddr;
  uint32_t fst2;
  uint32_t wt0_local;
  CPUMIPSState_conflict5 *env_local;
  
  fVar1 = int32_to_float32_mips64(wt0,&(env->active_fpu).fp_status);
  update_fcr31(env,unaff_retaddr);
  return fVar1;
}

Assistant:

uint32_t helper_float_cvts_w(CPUMIPSState *env, uint32_t wt0)
{
    uint32_t fst2;

    fst2 = int32_to_float32(wt0, &env->active_fpu.fp_status);
    update_fcr31(env, GETPC());
    return fst2;
}